

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O3

ParameterSymbolBase * __thiscall
slang::ast::ParameterBuilder::createParam
          (ParameterBuilder *this,ParameterDecl *decl,Scope *newScope,SourceLocation instanceLoc)

{
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar1;
  ParameterSymbolBase *pPVar2;
  undefined1 *puVar3;
  char *pcVar4;
  group_type_pointer pgVar5;
  undefined4 uVar6;
  Compilation *compilation;
  long lVar7;
  ForwardTypeRestrictionSyntax *syntax;
  SyntaxNode *pSVar8;
  EqualsTypeClauseSyntax *pEVar9;
  HierarchyOverrideNode *pHVar10;
  value_type_pointer ppVar11;
  ulong uVar12;
  TypeAssignmentSyntax *pTVar13;
  Scope *this_00;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  char cVar17;
  char cVar18;
  char cVar19;
  bool bVar20;
  byte bVar21;
  uint uVar22;
  uint64_t uVar23;
  TypeParameterSymbol *this_01;
  NamedTypeSyntax *pNVar24;
  ParameterSymbol *this_02;
  ParameterDeclarationSyntax *pPVar25;
  SourceLocation SVar26;
  Diagnostic *this_03;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ASTContext *pAVar30;
  ulong uVar31;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  byte bVar32;
  NameSyntax *nameSyntax;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_04;
  SyntaxNode *this_05;
  uchar uVar33;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  ForwardTypeRestriction typeRestriction;
  basic_string_view<char,_std::char_traits<char>_> *local_118;
  ParameterDecl *local_110;
  ParameterBuilder *local_108;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_100;
  SourceLocation instanceLoc_local;
  undefined1 local_b8 [40];
  undefined1 local_90 [16];
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  compilation = this->scope->compilation;
  this_04 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
            &(this->assignments).super_Storage.field_0x108;
  local_118 = &decl->name;
  instanceLoc_local = instanceLoc;
  uVar23 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_04,
                      local_118);
  uVar27 = uVar23 >> ((this->assignments).field_0x110 & 0x3f);
  lVar28 = (uVar23 & 0xff) * 4;
  cVar17 = (&UNK_0047072c)[lVar28];
  cVar18 = (&UNK_0047072d)[lVar28];
  cVar19 = (&UNK_0047072e)[lVar28];
  bVar32 = (&UNK_0047072f)[lVar28];
  uVar29 = 0;
  do {
    lVar28 = *(long *)&(this->assignments).field_0x120;
    pcVar4 = (char *)(lVar28 + uVar27 * 0x10);
    bVar21 = pcVar4[0xf];
    auVar34[0] = -(*pcVar4 == cVar17);
    auVar34[1] = -(pcVar4[1] == cVar18);
    auVar34[2] = -(pcVar4[2] == cVar19);
    auVar34[3] = -(pcVar4[3] == bVar32);
    auVar34[4] = -(pcVar4[4] == cVar17);
    auVar34[5] = -(pcVar4[5] == cVar18);
    auVar34[6] = -(pcVar4[6] == cVar19);
    auVar34[7] = -(pcVar4[7] == bVar32);
    auVar34[8] = -(pcVar4[8] == cVar17);
    auVar34[9] = -(pcVar4[9] == cVar18);
    auVar34[10] = -(pcVar4[10] == cVar19);
    auVar34[0xb] = -(pcVar4[0xb] == bVar32);
    auVar34[0xc] = -(pcVar4[0xc] == cVar17);
    auVar34[0xd] = -(pcVar4[0xd] == cVar18);
    auVar34[0xe] = -(pcVar4[0xe] == cVar19);
    auVar34[0xf] = -(bVar21 == bVar32);
    uVar22 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
    if (uVar22 != 0) {
      lVar7 = *(long *)&(this->assignments).field_0x128;
      local_110 = decl;
      local_108 = this;
      local_100 = this_04;
      do {
        iVar14 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((ulong)(uint)(iVar14 << 5) + lVar7 + uVar27 * 0x1e0);
        bVar20 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           (local_100,local_118,__y);
        this = local_108;
        decl = local_110;
        if (bVar20) {
          this_05 = (SyntaxNode *)__y[1]._M_len;
          bVar32 = *(byte *)&__y[1]._M_str;
          goto LAB_0013cea1;
        }
        uVar22 = uVar22 - 1 & uVar22;
      } while (uVar22 != 0);
      bVar21 = *(byte *)(lVar28 + uVar27 * 0x10 + 0xf);
      this_04 = local_100;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar23 & 7] & bVar21) == 0) break;
    uVar31 = *(ulong *)&(this->assignments).field_0x118;
    lVar28 = uVar27 + uVar29;
    uVar29 = uVar29 + 1;
    uVar27 = lVar28 + 1U & uVar31;
  } while (uVar29 <= uVar31);
  bVar32 = 0;
  this_05 = (SyntaxNode *)0x0;
LAB_0013cea1:
  if (decl->isTypeParam != true) {
    this_02 = BumpAllocator::
              emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&>
                        (&compilation->super_BumpAllocator,local_118,&decl->location,
                         &decl->isLocalParam,&decl->isPortParam);
    Symbol::setAttributes((Symbol *)this_02,this->scope,decl->attributes);
    if (decl->hasSyntax == true) {
      (this_02->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)decl->field_1;
      pPVar25 = (decl->field_0).valueSyntax;
      pSVar8 = (pPVar25->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
      if (pSVar8 != (SyntaxNode *)0x0) {
        Scope::addMembers(newScope,pSVar8);
      }
      pSVar8 = (pPVar25->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
      if ((pSVar8->kind == ParameterDeclarationStatement) &&
         (pSVar8 = pSVar8->previewNode, pSVar8 != (SyntaxNode *)0x0)) {
        Scope::addMembers(newScope,pSVar8);
      }
    }
    if (this_05 != (SyntaxNode *)0x0) {
      pbVar1 = &(this_02->super_ValueSymbol).declaredType.flags;
      *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 4;
    }
    if (decl->hasSyntax == false) {
      (this_02->super_ValueSymbol).declaredType.type = (decl->field_0).givenType;
      if ((decl->field_1).valueDecl != (DeclaratorSyntax *)0x0) {
        (this_02->super_ValueSymbol).declaredType.initializer =
             (Expression *)(decl->field_1).valueDecl;
      }
    }
    else {
      (this_02->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)
           (((decl->field_0).givenType)->super_Symbol).nextInScope;
      puVar3 = &(this_02->super_ValueSymbol).declaredType.field_0x3f;
      *puVar3 = *puVar3 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_02->super_ValueSymbol,(decl->field_1).valueDecl);
    }
    if (this_05 != (SyntaxNode *)0x0) {
      local_b8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_05);
      SVar26 = parsing::Token::location((Token *)local_b8);
      (this_02->super_ValueSymbol).declaredType.initializerSyntax = (ExpressionSyntax *)this_05;
      (this_02->super_ValueSymbol).declaredType.initializerLocation = SVar26;
    }
    Scope::insertMember(newScope,(Symbol *)this_02,newScope->lastMember,false,true);
    pSVar8 = (this_02->super_ValueSymbol).super_Symbol.originatingSyntax;
    pHVar10 = this->overrideNode;
    if ((pSVar8 != (SyntaxNode *)0x0 && pHVar10 != (HierarchyOverrideNode *)0x0) &&
        (bVar32 & 1) == 0) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pSVar8;
      uVar29 = SUB168(auVar16 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar16 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar27 = uVar29 >> ((byte)(pHVar10->paramOverrides).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar6 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar29 & 0xff];
      uVar31 = 0;
      do {
        pgVar5 = (pHVar10->paramOverrides).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 .arrays.groups_ + uVar27;
        bVar21 = pgVar5->m[0xf].n;
        uVar33 = (uchar)uVar6;
        auVar38[0] = -(pgVar5->m[0].n == uVar33);
        uVar35 = (uchar)((uint)uVar6 >> 8);
        auVar38[1] = -(pgVar5->m[1].n == uVar35);
        uVar36 = (uchar)((uint)uVar6 >> 0x10);
        auVar38[2] = -(pgVar5->m[2].n == uVar36);
        bVar37 = (byte)((uint)uVar6 >> 0x18);
        auVar38[3] = -(pgVar5->m[3].n == bVar37);
        auVar38[4] = -(pgVar5->m[4].n == uVar33);
        auVar38[5] = -(pgVar5->m[5].n == uVar35);
        auVar38[6] = -(pgVar5->m[6].n == uVar36);
        auVar38[7] = -(pgVar5->m[7].n == bVar37);
        auVar38[8] = -(pgVar5->m[8].n == uVar33);
        auVar38[9] = -(pgVar5->m[9].n == uVar35);
        auVar38[10] = -(pgVar5->m[10].n == uVar36);
        auVar38[0xb] = -(pgVar5->m[0xb].n == bVar37);
        auVar38[0xc] = -(pgVar5->m[0xc].n == uVar33);
        auVar38[0xd] = -(pgVar5->m[0xd].n == uVar35);
        auVar38[0xe] = -(pgVar5->m[0xe].n == uVar36);
        auVar38[0xf] = -(bVar21 == bVar37);
        uVar22 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
        if (uVar22 != 0) {
          ppVar11 = (pHVar10->paramOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                    .arrays.elements_;
          do {
            uVar15 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            if (pSVar8 == ppVar11[uVar27 * 0xf + (ulong)uVar15].first) {
              std::__detail::__variant::
              _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_58,
                                (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&ppVar11[uVar27 * 0xf + (ulong)uVar15].second);
              ParameterSymbol::setValue(this_02,compilation,(ConstantValue *)&local_58,true);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_58);
              return &this_02->super_ParameterSymbolBase;
            }
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar21) == 0) break;
        uVar12 = (pHVar10->paramOverrides).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 .arrays.groups_size_mask;
        lVar28 = uVar27 + uVar31;
        uVar31 = uVar31 + 1;
        uVar27 = lVar28 + 1U & uVar12;
      } while (uVar31 <= uVar12);
    }
    pPVar2 = &this_02->super_ParameterSymbolBase;
    if ((this_02->super_ParameterSymbolBase).isLocal != false) {
      return pPVar2;
    }
    if (this->forceInvalidValues == true) {
      local_80._M_index = None;
      ParameterSymbol::setValue(this_02,compilation,(ConstantValue *)&local_80,false);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_80);
      return pPVar2;
    }
    if (this_05 != (SyntaxNode *)0x0) {
      if (bVar32 == 0) {
        pAVar30 = this->instanceContext;
        if (pAVar30 == (ASTContext *)0x0) {
          return pPVar2;
        }
      }
      else {
        this_02->isFromConf = true;
        pAVar30 = (ASTContext *)local_b8;
        local_b8._8_4_ = 0xffffffff;
        local_b8._0_8_ = this->configScope;
        local_b8._16_8_ = (anon_union_8_2_f12d5f64_for_typeOrLink)0x10000000000;
        local_b8._24_16_ = (undefined1  [16])0x0;
        local_90 = (undefined1  [16])0x0;
      }
      DeclaredType::resolveAt(&(this_02->super_ValueSymbol).declaredType,pAVar30);
      return pPVar2;
    }
    if ((this_02->super_ParameterSymbolBase).isPort != true) {
      return pPVar2;
    }
    if ((this_02->super_ValueSymbol).declaredType.initializerSyntax != (ExpressionSyntax *)0x0) {
      return pPVar2;
    }
    createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
    ::$_0::operator()((__0 *)this,(ParameterSymbol *)&instanceLoc_local);
    return pPVar2;
  }
  typeRestriction = None;
  if (((decl->hasSyntax == true) &&
      ((decl->field_0).typeSyntax != (TypeParameterDeclarationSyntax *)0x0)) &&
     (syntax = ((decl->field_0).typeSyntax)->typeRestriction,
     syntax != (ForwardTypeRestrictionSyntax *)0x0)) {
    typeRestriction = SemanticFacts::getTypeRestriction(syntax);
  }
  this_01 = BumpAllocator::
            emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&,slang::ast::ForwardTypeRestriction&>
                      (&compilation->super_BumpAllocator,newScope,local_118,&decl->location,
                       &decl->isLocalParam,&decl->isPortParam,&typeRestriction);
  Symbol::setAttributes(&this_01->super_Symbol,this->scope,decl->attributes);
  if (decl->hasSyntax == true) {
    pPVar25 = (decl->field_0).valueSyntax;
    pSVar8 = (pPVar25->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode;
    if (pSVar8 != (SyntaxNode *)0x0) {
      Scope::addMembers(newScope,pSVar8);
    }
    pSVar8 = (pPVar25->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent;
    if ((pSVar8->kind == ParameterDeclarationStatement) &&
       (pSVar8 = pSVar8->previewNode, pSVar8 != (SyntaxNode *)0x0)) {
      Scope::addMembers(newScope,pSVar8);
    }
    if (((decl->field_1).typeDecl != (TypeAssignmentSyntax *)0x0) &&
       (pEVar9 = ((decl->field_1).typeDecl)->assignment, pEVar9 != (EqualsTypeClauseSyntax *)0x0)) {
      (this_01->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)(pEVar9->type).ptr;
    }
  }
  if (this_05 == (SyntaxNode *)0x0) {
    if (decl->hasSyntax == false) {
      pPVar25 = (decl->field_0).valueSyntax;
      if (pPVar25 == (ParameterDeclarationSyntax *)0x0) goto LAB_0013d280;
    }
    else {
      pTVar13 = (decl->field_1).typeDecl;
      (this_01->super_Symbol).originatingSyntax = &pTVar13->super_SyntaxNode;
      pEVar9 = pTVar13->assignment;
      if (pEVar9 != (EqualsTypeClauseSyntax *)0x0) {
        pNVar24 = (NamedTypeSyntax *)(pEVar9->type).ptr;
        goto LAB_0013d204;
      }
LAB_0013d280:
      pPVar25 = (ParameterDeclarationSyntax *)compilation->errorType;
    }
    (this_01->targetType).type = (Type *)pPVar25;
  }
  else {
    pbVar1 = &(this_01->targetType).flags;
    *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 8;
    bVar20 = slang::syntax::NameSyntax::isKind(this_05->kind);
    if (bVar20) {
      pNVar24 = BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NameSyntax&>
                          (&compilation->super_BumpAllocator,(NameSyntax *)this_05);
LAB_0013d204:
      (this_01->targetType).typeOrLink.typeSyntax = &pNVar24->super_DataTypeSyntax;
    }
    else {
      bVar20 = slang::syntax::DataTypeSyntax::isKind(this_05->kind);
      if (!bVar20) {
        (this_01->targetType).type = compilation->errorType;
        this_00 = this->scope;
        local_b8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_05);
        SVar26 = parsing::Token::location((Token *)local_b8);
        this_03 = Scope::addDiag(this_00,(DiagCode)0x60006,SVar26);
        Diagnostic::operator<<(this_03,(this_01->super_Symbol).name);
        goto LAB_0013d348;
      }
      (this_01->targetType).typeOrLink.typeSyntax = (DataTypeSyntax *)this_05;
    }
    puVar3 = &(this_01->targetType).field_0x3f;
    *puVar3 = *puVar3 & 0x7f;
  }
LAB_0013d348:
  Scope::insertMember(newScope,&this_01->super_Symbol,newScope->lastMember,false,true);
  if ((this_01->super_ParameterSymbolBase).isLocal == false) {
    if (this->forceInvalidValues == true) {
      (this_01->targetType).type = compilation->errorType;
    }
    else if (this_05 == (SyntaxNode *)0x0) {
      if ((((this_01->super_ParameterSymbolBase).isPort == true) &&
          ((*(int *)&(this_01->targetType).field_0x3c < 0 ||
           ((this_01->targetType).typeOrLink.typeSyntax == (DataTypeSyntax *)0x0)))) &&
         ((decl->hasSyntax != false ||
          ((decl->field_0).valueSyntax == (ParameterDeclarationSyntax *)0x0)))) {
        createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
        ::$_0::operator()((__0 *)this,(TypeParameterSymbol *)&instanceLoc_local);
      }
    }
    else {
      if (bVar32 == 0) {
        pAVar30 = this->instanceContext;
        if (pAVar30 == (ASTContext *)0x0) goto LAB_0013d41c;
      }
      else {
        pAVar30 = (ASTContext *)local_b8;
        local_b8._8_4_ = 0xffffffff;
        local_b8._0_8_ = this->configScope;
        local_b8._16_8_ = (anon_union_8_2_f12d5f64_for_typeOrLink)0x10000000000;
        local_b8._24_16_ = (undefined1  [16])0x0;
        local_90 = (undefined1  [16])0x0;
      }
      DeclaredType::forceResolveAt(&this_01->targetType,pAVar30);
    }
  }
LAB_0013d41c:
  return &this_01->super_ParameterSymbolBase;
}

Assistant:

const ParameterSymbolBase& ParameterBuilder::createParam(
    const DefinitionSymbol::ParameterDecl& decl, Scope& newScope, SourceLocation instanceLoc) {

    auto reportError = [&](auto& param) {
        anyErrors = true;
        if (!suppressErrors && !param.name.empty()) {
            auto& diag = scope.addDiag(diag::ParamHasNoValue, instanceLoc);
            diag << definitionName;
            diag << param.name;
        }
    };

    auto handlePreviewNodes = [&](const SyntaxNode& syntax) {
        // Two cases where we might have enum definitions to catch
        // via the preview nodes; for parameter decl members,
        // we need to look at the parent, and for port lists we
        // should just look at the param itself.
        if (syntax.previewNode)
            newScope.addMembers(*syntax.previewNode);

        if (syntax.parent->kind == SyntaxKind::ParameterDeclarationStatement &&
            syntax.parent->previewNode) {
            newScope.addMembers(*syntax.parent->previewNode);
        }
    };

    auto& comp = scope.getCompilation();
    const ExpressionSyntax* newInitializer = nullptr;
    bool isFromConfig = false;
    if (auto it = assignments.find(decl.name); it != assignments.end())
        std::tie(newInitializer, isFromConfig) = it->second;

    if (decl.isTypeParam) {
        auto typeRestriction = ForwardTypeRestriction::None;
        if (decl.hasSyntax && decl.typeSyntax && decl.typeSyntax->typeRestriction)
            typeRestriction = SemanticFacts::getTypeRestriction(*decl.typeSyntax->typeRestriction);

        auto param = comp.emplace<TypeParameterSymbol>(newScope, decl.name, decl.location,
                                                       decl.isLocalParam, decl.isPortParam,
                                                       typeRestriction);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            handlePreviewNodes(*decl.typeSyntax);
            if (decl.typeDecl && decl.typeDecl->assignment)
                param->defaultValSyntax = decl.typeDecl->assignment->type;
        }

        auto& tt = param->targetType;
        if (newInitializer) {
            // If this is a NameSyntax, the parser didn't know we were assigning to
            // a type parameter, so fix it up into a NamedTypeSyntax to get a type from it.
            tt.addFlags(DeclaredTypeFlags::TypeOverridden);
            if (NameSyntax::isKind(newInitializer->kind)) {
                // const_cast is ugly but safe here, we're only going to refer to it
                // by const reference everywhere down.
                auto& nameSyntax = const_cast<NameSyntax&>(newInitializer->as<NameSyntax>());
                auto namedType = comp.emplace<NamedTypeSyntax>(nameSyntax);

                tt.setTypeSyntax(*namedType);
            }
            else if (!DataTypeSyntax::isKind(newInitializer->kind)) {
                tt.setType(comp.getErrorType());
                scope.addDiag(diag::BadTypeParamExpr, newInitializer->getFirstToken().location())
                    << param->name;
            }
            else {
                tt.setTypeSyntax(newInitializer->as<DataTypeSyntax>());
            }
        }
        else if (!decl.hasSyntax) {
            if (decl.givenType)
                tt.setType(*decl.givenType);
            else
                tt.setType(comp.getErrorType());
        }
        else {
            SLANG_ASSERT(decl.typeDecl);
            param->setSyntax(*decl.typeDecl);
            if (decl.typeDecl->assignment)
                tt.setTypeSyntax(*decl.typeDecl->assignment->type);
            else
                tt.setType(comp.getErrorType());
        }

        newScope.addMember(*param);

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                tt.setType(comp.getErrorType());
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    tt.forceResolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    tt.forceResolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !tt.getTypeSyntax() &&
                     (decl.hasSyntax || !decl.givenType)) {
                reportError(*param);
            }
        }

        return *param;
    }
    else {
        auto param = comp.emplace<ParameterSymbol>(decl.name, decl.location, decl.isLocalParam,
                                                   decl.isPortParam);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            param->defaultValSyntax = decl.valueDecl;
            handlePreviewNodes(*decl.valueSyntax);
        }

        auto& declType = *param->getDeclaredType();
        if (newInitializer)
            declType.addFlags(DeclaredTypeFlags::InitializerOverridden);

        if (!decl.hasSyntax) {
            SLANG_ASSERT(decl.givenType);
            param->setType(*decl.givenType);
            if (decl.givenInitializer)
                param->setInitializer(*decl.givenInitializer);
        }
        else {
            SLANG_ASSERT(decl.valueSyntax);
            SLANG_ASSERT(decl.valueDecl);

            param->setDeclaredType(*decl.valueSyntax->type);
            param->setFromDeclarator(*decl.valueDecl);
        }

        if (newInitializer) {
            param->setInitializerSyntax(*newInitializer,
                                        newInitializer->getFirstToken().location());
        }

        newScope.addMember(*param);

        // If there is an override node, see if this parameter is in it.
        // Note that we ignore the override node if this is from a configuration,
        // as the LRM says config overrides take precedence over defparams.
        if (auto paramSyntax = param->getSyntax(); overrideNode && paramSyntax && !isFromConfig) {
            if (auto it = overrideNode->paramOverrides.find(paramSyntax);
                it != overrideNode->paramOverrides.end()) {
                param->setValue(comp, it->second.first, /* needsCoercion */ true);
                return *param;
            }
        }

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                param->setValue(comp, nullptr, /* needsCoercion */ false);
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    param->setIsFromConfig(true);
                    declType.resolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    declType.resolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !declType.getInitializerSyntax()) {
                reportError(*param);
            }
        }

        return *param;
    }
}